

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_TeeBee.cpp
# Opt level: O0

void TeeBee::CalcPattern(Data *data)

{
  ulong uVar1;
  float fVar2;
  int local_18;
  int note;
  int i;
  Random random;
  Data *data_local;
  
  fVar2 = data->p[0] * 1000.0;
  uVar1 = (ulong)fVar2;
  _i = data;
  Random::Seed((Random *)&note,uVar1 | (long)(fVar2 - 9.223372e+18) & (long)uVar1 >> 0x3f);
  for (local_18 = 0; local_18 < 0x40; local_18 = local_18 + 1) {
    fVar2 = Random::GetFloat((Random *)&note,_i->p[1],_i->p[2]);
    fVar2 = powf(2.0,(float)((int)fVar2 + -0x3c) / 12.0);
    _i->pattern[local_18] = fVar2 * 440.0;
  }
  return;
}

Assistant:

static void CalcPattern(EffectData::Data* data)
    {
        Random random;
        random.Seed((unsigned long)(data->p[P_SEED] * 1000));
        for (int i = 0; i < 64; i++)
        {
            int note = (int)random.GetFloat(data->p[P_MINNOTE], data->p[P_MAXNOTE]);
            data->pattern[i] = 440.0f * powf(2.0f, (note - 60) / 12.0f);
        }
    }